

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O1

void __thiscall
sigslot::has_slots<sigslot::multi_threaded_local>::disconnect_all
          (has_slots<sigslot::multi_threaded_local> *this)

{
  _Rb_tree_header *__last;
  _Rb_tree_node_base *p_Var1;
  
  (*(this->super_multi_threaded_local)._vptr_multi_threaded_local[2])();
  __last = &(this->m_senders)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var1 = (this->m_senders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != __last;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x20))(*(long **)(p_Var1 + 1),this);
  }
  std::
  _Rb_tree<sigslot::_signal_base<sigslot::multi_threaded_local>_*,_sigslot::_signal_base<sigslot::multi_threaded_local>_*,_std::_Identity<sigslot::_signal_base<sigslot::multi_threaded_local>_*>,_std::less<sigslot::_signal_base<sigslot::multi_threaded_local>_*>,_std::allocator<sigslot::_signal_base<sigslot::multi_threaded_local>_*>_>
  ::_M_erase_aux(&(this->m_senders)._M_t,
                 (this->m_senders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)__last);
  (*(this->super_multi_threaded_local)._vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void disconnect_all()
		{
			lock_block<mt_policy> lock(this);
			const_iterator it = m_senders.begin();
			const_iterator itEnd = m_senders.end();

			while(it != itEnd)
			{
				(*it)->slot_disconnect(this);
				++it;
			}

			m_senders.erase(m_senders.begin(), m_senders.end());
		}